

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resonant_filter.cc
# Opt level: O0

float __thiscall ResonantFilter1::Gen(ResonantFilter1 *this)

{
  ulong uVar1;
  double dVar2;
  float *pfVar3;
  long in_RDI;
  float fVar4;
  undefined8 uVar9;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double v;
  
  fVar4 = (float)(**(code **)**(undefined8 **)(in_RDI + 8))();
  uVar1 = *(ulong *)(in_RDI + 0x20);
  uVar9 = 0;
  pfVar3 = CircularBuffer<float>::operator[]((CircularBuffer<float> *)(in_RDI + 0x10),0);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (double)fVar4;
  auVar5._0_8_ = (double)*pfVar3;
  auVar5._8_8_ = uVar9;
  uVar9 = 0;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar1 ^ 0x8000000000000000;
  auVar5 = vfmadd213sd_fma(auVar5,auVar10,auVar14);
  uVar1 = *(ulong *)(in_RDI + 0x28);
  pfVar3 = CircularBuffer<float>::operator[]((CircularBuffer<float> *)(in_RDI + 0x10),1);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = auVar5._0_8_;
  auVar11._0_8_ = (double)*pfVar3;
  auVar11._8_8_ = uVar9;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1 ^ 0x8000000000000000;
  auVar5 = vfmadd213sd_fma(auVar11,auVar6,auVar15);
  CircularBuffer<float>::push_front((CircularBuffer<float> *)(in_RDI + 0x10),(float)auVar5._0_8_);
  uVar1 = *(ulong *)(in_RDI + 0x30);
  pfVar3 = CircularBuffer<float>::operator[]((CircularBuffer<float> *)(in_RDI + 0x10),0);
  auVar7._0_8_ = (double)*pfVar3;
  dVar2 = *(double *)(in_RDI + 0x38);
  pfVar3 = CircularBuffer<float>::operator[]((CircularBuffer<float> *)(in_RDI + 0x10),1);
  auVar7._8_8_ = 0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar1;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar2 * (double)*pfVar3;
  auVar5 = vfmadd213sd_fma(auVar7,auVar12,auVar16);
  uVar1 = *(ulong *)(in_RDI + 0x40);
  uVar9 = 0;
  pfVar3 = CircularBuffer<float>::operator[]((CircularBuffer<float> *)(in_RDI + 0x10),2);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = auVar5._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar1;
  auVar8._0_8_ = (double)*pfVar3;
  auVar8._8_8_ = uVar9;
  auVar5 = vfmadd213sd_fma(auVar8,auVar13,auVar17);
  return (float)auVar5._0_8_;
}

Assistant:

float ResonantFilter1::Gen()
{
    double v = src_->Gen();
    buf_.push_front(v - a_[0] * buf_[0] - a_[1] * buf_[1]);
    v = b_[0] * buf_[0] + b_[1] * buf_[1] + b_[2] * buf_[2];
    return v;
}